

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509.cc
# Opt level: O0

int i2d_x509_aux_internal(X509 *a,uchar **pp)

{
  int iVar1;
  bool bVar2;
  uchar *local_38;
  uchar *start;
  int tmplen;
  int length;
  uchar **pp_local;
  X509 *a_local;
  
  if (pp == (uchar **)0x0) {
    local_38 = (uchar *)0x0;
  }
  else {
    local_38 = *pp;
  }
  bVar2 = true;
  if (pp != (uchar **)0x0) {
    bVar2 = *pp != (uchar *)0x0;
  }
  if (bVar2) {
    start._4_4_ = i2d_X509(a,pp);
    a_local._4_4_ = start._4_4_;
    if ((0 < start._4_4_) && (a != (X509 *)0x0)) {
      if (a->aux != (X509_CERT_AUX *)0x0) {
        iVar1 = i2d_X509_CERT_AUX((X509_CERT_AUX *)a->aux,pp);
        if (iVar1 < 0) {
          if (local_38 == (uchar *)0x0) {
            return iVar1;
          }
          *pp = local_38;
          return iVar1;
        }
        start._4_4_ = iVar1 + start._4_4_;
      }
      a_local._4_4_ = start._4_4_;
    }
    return a_local._4_4_;
  }
  __assert_fail("pp == NULL || *pp != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_x509.cc"
                ,0x17b,"int i2d_x509_aux_internal(X509 *, unsigned char **)");
}

Assistant:

static int i2d_x509_aux_internal(X509 *a, unsigned char **pp) {
  int length, tmplen;
  unsigned char *start = pp != NULL ? *pp : NULL;

  assert(pp == NULL || *pp != NULL);

  // This might perturb *pp on error, but fixing that belongs in i2d_X509()
  // not here.  It should be that if a == NULL length is zero, but we check
  // both just in case.
  length = i2d_X509(a, pp);
  if (length <= 0 || a == NULL) {
    return length;
  }

  if (a->aux != NULL) {
    tmplen = i2d_X509_CERT_AUX(a->aux, pp);
    if (tmplen < 0) {
      if (start != NULL) {
        *pp = start;
      }
      return tmplen;
    }
    length += tmplen;
  }

  return length;
}